

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

uint xmlHashQNameValue(uint seed,xmlChar *prefix,xmlChar *name,xmlChar *prefix2,xmlChar *name2,
                      xmlChar *prefix3,xmlChar *name3)

{
  uint uVar1;
  uint uVar2;
  uint local_40;
  uint ch;
  uint h2;
  uint h1;
  xmlChar *prefix3_local;
  xmlChar *name2_local;
  xmlChar *prefix2_local;
  xmlChar *name_local;
  xmlChar *prefix_local;
  uint seed_local;
  
  ch = seed ^ 0x3b00;
  local_40 = seed << 0xf | seed >> 0x11;
  name_local = prefix;
  if (prefix != (xmlChar *)0x0) {
    while( true ) {
      if (*name_local == 0) break;
      ch = (*name_local + ch) * 9;
      local_40 = ((ch + local_40) * 0x80 | ch + local_40 >> 0x19) * 5;
      name_local = name_local + 1;
    }
    ch = (ch + 0x3a) * 9;
    local_40 = ((ch + local_40) * 0x80 | ch + local_40 >> 0x19) * 5;
  }
  prefix2_local = name;
  if (name != (xmlChar *)0x0) {
    while( true ) {
      if (*prefix2_local == 0) break;
      ch = (*prefix2_local + ch) * 9;
      local_40 = ((ch + local_40) * 0x80 | ch + local_40 >> 0x19) * 5;
      prefix2_local = prefix2_local + 1;
    }
  }
  ch = ch * 9;
  local_40 = ((ch + local_40) * 0x80 | ch + local_40 >> 0x19) * 5;
  name2_local = prefix2;
  if (prefix2 != (xmlChar *)0x0) {
    while( true ) {
      if (*name2_local == 0) break;
      ch = (*name2_local + ch) * 9;
      local_40 = ((ch + local_40) * 0x80 | ch + local_40 >> 0x19) * 5;
      name2_local = name2_local + 1;
    }
    ch = (ch + 0x3a) * 9;
    local_40 = ((ch + local_40) * 0x80 | ch + local_40 >> 0x19) * 5;
  }
  prefix3_local = name2;
  if (name2 != (xmlChar *)0x0) {
    while( true ) {
      if (*prefix3_local == 0) break;
      ch = (*prefix3_local + ch) * 9;
      local_40 = ((ch + local_40) * 0x80 | ch + local_40 >> 0x19) * 5;
      prefix3_local = prefix3_local + 1;
    }
  }
  ch = ch * 9;
  local_40 = ((ch + local_40) * 0x80 | ch + local_40 >> 0x19) * 5;
  _h2 = prefix3;
  if (prefix3 != (xmlChar *)0x0) {
    while( true ) {
      if (*_h2 == 0) break;
      ch = (*_h2 + ch) * 9;
      local_40 = ((ch + local_40) * 0x80 | ch + local_40 >> 0x19) * 5;
      _h2 = _h2 + 1;
    }
    ch = (ch + 0x3a) * 9;
    local_40 = ((ch + local_40) * 0x80 | ch + local_40 >> 0x19) * 5;
  }
  if (name3 != (xmlChar *)0x0) {
    while( true ) {
      if (*name3 == 0) break;
      ch = (*name3 + ch) * 9;
      local_40 = ((ch + local_40) * 0x80 | ch + local_40 >> 0x19) * 5;
      name3 = name3 + 1;
    }
  }
  uVar1 = (local_40 << 0xe | local_40 >> 0x12) + (local_40 ^ ch);
  uVar2 = (uVar1 >> 6 | uVar1 * 0x4000000) + (uVar1 ^ local_40);
  uVar1 = (uVar2 * 0x20 | uVar2 >> 0x1b) + (uVar2 ^ uVar1);
  return (uVar1 >> 8 | uVar1 * 0x1000000) + (uVar1 ^ uVar2);
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static unsigned
xmlHashQNameValue(unsigned seed,
                  const xmlChar *prefix, const xmlChar *name,
                  const xmlChar *prefix2, const xmlChar *name2,
                  const xmlChar *prefix3, const xmlChar *name3) {
    unsigned h1, h2, ch;

    HASH_INIT(h1, h2, seed);

    if (prefix != NULL) {
        while ((ch = *prefix++) != 0) {
            HASH_UPDATE(h1, h2, ch);
        }
        HASH_UPDATE(h1, h2, ':');
    }
    if (name != NULL) {
        while ((ch = *name++) != 0) {
            HASH_UPDATE(h1, h2, ch);
        }
    }
    HASH_UPDATE(h1, h2, 0);
    if (prefix2 != NULL) {
        while ((ch = *prefix2++) != 0) {
            HASH_UPDATE(h1, h2, ch);
        }
        HASH_UPDATE(h1, h2, ':');
    }
    if (name2 != NULL) {
        while ((ch = *name2++) != 0) {
            HASH_UPDATE(h1, h2, ch);
        }
    }
    HASH_UPDATE(h1, h2, 0);
    if (prefix3 != NULL) {
        while ((ch = *prefix3++) != 0) {
            HASH_UPDATE(h1, h2, ch);
        }
        HASH_UPDATE(h1, h2, ':');
    }
    if (name3 != NULL) {
        while ((ch = *name3++) != 0) {
            HASH_UPDATE(h1, h2, ch);
        }
    }

    HASH_FINISH(h1, h2);

    return(h2);
}